

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O3

cjpeg_source_ptr jinit_read_targa(j_compress_ptr cinfo)

{
  cjpeg_source_ptr pcVar1;
  
  pcVar1 = (cjpeg_source_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x78);
  pcVar1[1].start_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)cinfo;
  pcVar1->start_input = start_input_tga;
  pcVar1->finish_input = finish_input_tga;
  return pcVar1;
}

Assistant:

GLOBAL(cjpeg_source_ptr)
jinit_read_targa(j_compress_ptr cinfo)
{
  tga_source_ptr source;

  /* Create module interface object */
  source = (tga_source_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(tga_source_struct));
  source->cinfo = cinfo;        /* make back link for subroutines */
  /* Fill in method ptrs, except get_pixel_rows which start_input sets */
  source->pub.start_input = start_input_tga;
  source->pub.finish_input = finish_input_tga;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  source->pub.max_pixels = 0;
#endif

  return (cjpeg_source_ptr)source;
}